

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.h
# Opt level: O0

void __thiscall chrono::viper::ViperPart::~ViperPart(ViperPart *this)

{
  ViperPart *this_local;
  
  this->_vptr_ViperPart = (_func_int **)&PTR__ViperPart_002eeeb0;
  ChFrame<double>::~ChFrame(&this->m_cog);
  ChFrame<double>::~ChFrame(&this->m_pos);
  ChFrame<double>::~ChFrame(&this->m_mesh_xform);
  std::__cxx11::string::~string((string *)&this->m_mesh_name);
  std::shared_ptr<chrono::ChMaterialSurface>::~shared_ptr(&this->m_mat);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr(&this->m_body);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

virtual ~ViperPart() {}